

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

void __thiscall
slang::ast::ForeachLoopStatement::serializeTo(ForeachLoopStatement *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  ASTSerializer *in_RSI;
  allocator<char> *in_RDI;
  LoopDim *r;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *__range2;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
  *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  ASTSerializer *in_stack_ffffffffffffff18;
  ASTSerializer *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  ASTSerializer *this_00;
  int __fd;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  int local_a8;
  void *local_a0;
  bool local_82;
  undefined1 local_81 [65];
  __normal_iterator<const_slang::ast::ForeachLoopStatement::LoopDim_*,_std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>_>
  local_40;
  allocator<char> *local_38;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
             (char *)in_stack_ffffffffffffff18);
  ASTSerializer::write(in_RSI,local_20,local_18,*(size_t *)(in_RDI + 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
             (char *)in_stack_ffffffffffffff18);
  name._M_str = (char *)in_RSI;
  name._M_len = in_stack_ffffffffffffff28;
  ASTSerializer::startArray(in_stack_ffffffffffffff20,name);
  local_38 = in_RDI + 0x28;
  local_40._M_current =
       (LoopDim *)
       std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff08);
  local_81._57_8_ =
       std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::end
                 ((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff18);
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::ForeachLoopStatement::LoopDim_*,_std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::ForeachLoopStatement::LoopDim_*,_std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff10,
                            (__normal_iterator<const_slang::ast::ForeachLoopStatement::LoopDim_*,_std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_81._49_8_ =
         __gnu_cxx::
         __normal_iterator<const_slang::ast::ForeachLoopStatement::LoopDim_*,_std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>_>
         ::operator*(&local_40);
    ASTSerializer::startObject((ASTSerializer *)0xbd89f0);
    this_00 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
               (char *)in_stack_ffffffffffffff18);
    local_82 = std::optional::operator_cast_to_bool((optional<slang::ConstantRange> *)0xbd8a1e);
    if (local_82) {
      std::optional<slang::ConstantRange>::operator->((optional<slang::ConstantRange> *)0xbd8a36);
      ConstantRange::toString_abi_cxx11_((ConstantRange *)in_stack_ffffffffffffff20);
    }
    else {
      in_stack_ffffffffffffff20 = (ASTSerializer *)local_81;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_RDI);
    }
    local_82 = !local_82;
    ASTSerializer::write
              (this_00,(int)local_81._33_8_,(void *)local_81._41_8_,(size_t)(local_81 + 1));
    std::__cxx11::string::~string(in_stack_ffffffffffffff10);
    if (local_82) {
      std::allocator<char>::~allocator((allocator<char> *)local_81);
    }
    if (*(IteratorSymbol **)(local_81._49_8_ + 0x10) != (IteratorSymbol *)0x0) {
      in_stack_ffffffffffffff18 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
                 (char *)local_10);
      ASTSerializer::write
                (in_stack_ffffffffffffff18,local_a8,local_a0,
                 (size_t)*(IteratorSymbol **)(local_81._49_8_ + 0x10));
    }
    ASTSerializer::endObject((ASTSerializer *)0xbd8b4a);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::ForeachLoopStatement::LoopDim_*,_std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>_>
    ::operator++(&local_40);
  }
  ASTSerializer::endArray((ASTSerializer *)0xbd8b69);
  __fd = (int)in_stack_ffffffffffffff48;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
             (char *)in_stack_ffffffffffffff18);
  ASTSerializer::write(local_10,__fd,in_stack_ffffffffffffff50,*(size_t *)(in_RDI + 0x38));
  return;
}

Assistant:

void ForeachLoopStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.write("arrayRef", arrayRef);

    serializer.startArray("loopDims");
    for (auto& r : loopDims) {
        serializer.startObject();
        serializer.write("range", r.range ? r.range->toString() : "[]");
        if (r.loopVar)
            serializer.write("var", *r.loopVar);
        serializer.endObject();
    }
    serializer.endArray();

    serializer.write("body", body);
}